

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaTypeDump(xmlSchemaTypePtr type,FILE *output)

{
  FILE *output_local;
  xmlSchemaTypePtr type_local;
  
  if (type == (xmlSchemaTypePtr)0x0) {
    fprintf((FILE *)output,"Type: NULL\n");
  }
  else {
    fprintf((FILE *)output,"Type: ");
    if (type->name == (xmlChar *)0x0) {
      fprintf((FILE *)output,"(no name) ");
    }
    else {
      fprintf((FILE *)output,"\'%s\' ",type->name);
    }
    if (type->targetNamespace != (xmlChar *)0x0) {
      fprintf((FILE *)output,"ns \'%s\' ",type->targetNamespace);
    }
    switch(type->type) {
    case XML_SCHEMA_TYPE_BASIC:
      fprintf((FILE *)output,"[basic] ");
      break;
    default:
      fprintf((FILE *)output,"[unknown type %d] ",(ulong)type->type);
      break;
    case XML_SCHEMA_TYPE_SIMPLE:
      fprintf((FILE *)output,"[simple] ");
      break;
    case XML_SCHEMA_TYPE_COMPLEX:
      fprintf((FILE *)output,"[complex] ");
      break;
    case XML_SCHEMA_TYPE_SEQUENCE:
      fprintf((FILE *)output,"[sequence] ");
      break;
    case XML_SCHEMA_TYPE_CHOICE:
      fprintf((FILE *)output,"[choice] ");
      break;
    case XML_SCHEMA_TYPE_ALL:
      fprintf((FILE *)output,"[all] ");
      break;
    case XML_SCHEMA_TYPE_UR:
      fprintf((FILE *)output,"[ur] ");
      break;
    case XML_SCHEMA_TYPE_RESTRICTION:
      fprintf((FILE *)output,"[restriction] ");
      break;
    case XML_SCHEMA_TYPE_EXTENSION:
      fprintf((FILE *)output,"[extension] ");
    }
    fprintf((FILE *)output,"content: ");
    switch(type->contentType) {
    case XML_SCHEMA_CONTENT_UNKNOWN:
      fprintf((FILE *)output,"[unknown] ");
      break;
    case XML_SCHEMA_CONTENT_EMPTY:
      fprintf((FILE *)output,"[empty] ");
      break;
    case XML_SCHEMA_CONTENT_ELEMENTS:
      fprintf((FILE *)output,"[element] ");
      break;
    case XML_SCHEMA_CONTENT_MIXED:
      fprintf((FILE *)output,"[mixed] ");
      break;
    case XML_SCHEMA_CONTENT_SIMPLE:
      fprintf((FILE *)output,"[simple] ");
      break;
    case XML_SCHEMA_CONTENT_MIXED_OR_ELEMENTS:
      break;
    case XML_SCHEMA_CONTENT_BASIC:
      fprintf((FILE *)output,"[basic] ");
      break;
    case XML_SCHEMA_CONTENT_ANY:
      fprintf((FILE *)output,"[any] ");
    }
    fprintf((FILE *)output,"\n");
    if (type->base != (xmlChar *)0x0) {
      fprintf((FILE *)output,"  base type: \'%s\'",type->base);
      if (type->baseNs == (xmlChar *)0x0) {
        fprintf((FILE *)output,"\n");
      }
      else {
        fprintf((FILE *)output," ns \'%s\'\n",type->baseNs);
      }
    }
    if (type->attrUses != (void *)0x0) {
      xmlSchemaAttrUsesDump((xmlSchemaItemListPtr)type->attrUses,output);
    }
    if (type->annot != (xmlSchemaAnnotPtr)0x0) {
      xmlSchemaAnnotDump(output,type->annot);
    }
    if ((type->type == XML_SCHEMA_TYPE_COMPLEX) && (type->subtypes != (xmlSchemaTypePtr)0x0)) {
      xmlSchemaContentModelDump((xmlSchemaParticlePtr)type->subtypes,output,1);
    }
  }
  return;
}

Assistant:

static void
xmlSchemaTypeDump(xmlSchemaTypePtr type, FILE * output)
{
    if (type == NULL) {
        fprintf(output, "Type: NULL\n");
        return;
    }
    fprintf(output, "Type: ");
    if (type->name != NULL)
        fprintf(output, "'%s' ", type->name);
    else
        fprintf(output, "(no name) ");
    if (type->targetNamespace != NULL)
	fprintf(output, "ns '%s' ", type->targetNamespace);
    switch (type->type) {
        case XML_SCHEMA_TYPE_BASIC:
            fprintf(output, "[basic] ");
            break;
        case XML_SCHEMA_TYPE_SIMPLE:
            fprintf(output, "[simple] ");
            break;
        case XML_SCHEMA_TYPE_COMPLEX:
            fprintf(output, "[complex] ");
            break;
        case XML_SCHEMA_TYPE_SEQUENCE:
            fprintf(output, "[sequence] ");
            break;
        case XML_SCHEMA_TYPE_CHOICE:
            fprintf(output, "[choice] ");
            break;
        case XML_SCHEMA_TYPE_ALL:
            fprintf(output, "[all] ");
            break;
        case XML_SCHEMA_TYPE_UR:
            fprintf(output, "[ur] ");
            break;
        case XML_SCHEMA_TYPE_RESTRICTION:
            fprintf(output, "[restriction] ");
            break;
        case XML_SCHEMA_TYPE_EXTENSION:
            fprintf(output, "[extension] ");
            break;
        default:
            fprintf(output, "[unknown type %d] ", type->type);
            break;
    }
    fprintf(output, "content: ");
    switch (type->contentType) {
        case XML_SCHEMA_CONTENT_UNKNOWN:
            fprintf(output, "[unknown] ");
            break;
        case XML_SCHEMA_CONTENT_EMPTY:
            fprintf(output, "[empty] ");
            break;
        case XML_SCHEMA_CONTENT_ELEMENTS:
            fprintf(output, "[element] ");
            break;
        case XML_SCHEMA_CONTENT_MIXED:
            fprintf(output, "[mixed] ");
            break;
        case XML_SCHEMA_CONTENT_MIXED_OR_ELEMENTS:
	/* not used. */
            break;
        case XML_SCHEMA_CONTENT_BASIC:
            fprintf(output, "[basic] ");
            break;
        case XML_SCHEMA_CONTENT_SIMPLE:
            fprintf(output, "[simple] ");
            break;
        case XML_SCHEMA_CONTENT_ANY:
            fprintf(output, "[any] ");
            break;
    }
    fprintf(output, "\n");
    if (type->base != NULL) {
        fprintf(output, "  base type: '%s'", type->base);
	if (type->baseNs != NULL)
	    fprintf(output, " ns '%s'\n", type->baseNs);
	else
	    fprintf(output, "\n");
    }
    if (type->attrUses != NULL)
	xmlSchemaAttrUsesDump(type->attrUses, output);
    if (type->annot != NULL)
        xmlSchemaAnnotDump(output, type->annot);
#ifdef DUMP_CONTENT_MODEL
    if ((type->type == XML_SCHEMA_TYPE_COMPLEX) &&
	(type->subtypes != NULL)) {
	xmlSchemaContentModelDump((xmlSchemaParticlePtr) type->subtypes,
	    output, 1);
    }
#endif
}